

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::SingleKdTreeIndex::MergePartialFromCodedStream
          (SingleKdTreeIndex *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint32 uVar3;
  int iVar4;
  uint tag;
  ulong uVar5;
  bool bVar6;
  
  do {
    pbVar2 = input->buffer_;
    uVar3 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar3 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0013c5f2;
      input->buffer_ = pbVar2 + 1;
      uVar5 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0013c5f2:
      uVar3 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar3);
      uVar5 = 0;
      if (uVar3 - 1 < 0x7f) {
        uVar5 = 0x100000000;
      }
      uVar5 = uVar3 | uVar5;
    }
    tag = (uint)uVar5;
    if (((uVar5 & 0x100000000) == 0) || ((char)uVar5 != '\b' || (tag & 0xfffffff8) != 8)) {
      iVar4 = 7;
      if (((tag & 7) != 4 && tag != 0) &&
         (bVar6 = google::protobuf::internal::WireFormatLite::SkipField(input,tag), iVar4 = 6, bVar6
         )) goto LAB_0013c687;
    }
    else {
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar5 = (ulong)bVar1;
        uVar3 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_0013c66c;
        input->buffer_ = pbVar2 + 1;
        bVar6 = true;
      }
      else {
        uVar3 = 0;
LAB_0013c66c:
        uVar5 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar3);
        bVar6 = -1 < (long)uVar5;
      }
      iVar4 = 6;
      if (bVar6) {
        this->leafsize_ = (int32)uVar5;
LAB_0013c687:
        iVar4 = 0;
      }
    }
    if (iVar4 != 0) {
      return iVar4 != 6;
    }
  } while( true );
}

Assistant:

bool SingleKdTreeIndex::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.SingleKdTreeIndex)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int32 leafSize = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &leafsize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.SingleKdTreeIndex)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.SingleKdTreeIndex)
  return false;
#undef DO_
}